

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void riscv_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  target_ulong tVar1;
  CPUArchState_conflict26 *env;
  target_ulong tVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  TCGTemp *pTVar9;
  _Bool _Var10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uintptr_t o_3;
  undefined1 *puVar15;
  long *plVar16;
  TCGv_i32 pTVar17;
  uintptr_t o_5;
  TCGCond cond;
  MemOp MVar18;
  uintptr_t o_6;
  code *pcVar19;
  byte bVar20;
  uintptr_t o;
  TCGTemp *pTVar21;
  TCGContext_conflict11 *pTVar22;
  uintptr_t o_8;
  TCGv_i64 pTVar23;
  byte bVar24;
  uintptr_t o_2;
  TCGTemp *pTVar25;
  uintptr_t o_1;
  TCGTemp *pTVar26;
  uintptr_t o_7;
  undefined8 *puVar27;
  TCGContext_conflict11 *pTVar28;
  anon_union_16_2_88bb8dd4_for_ops_free_ops *paVar29;
  TCGv_i64 pTVar30;
  undefined8 local_b8;
  undefined8 local_b0;
  TCGTemp *local_a8;
  TCGTemp *local_a0;
  DisasContext_conflict12 *local_90;
  TCGContext_conflict11 *local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  CPUArchState_conflict26 *local_70;
  void *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  pTVar25 = (TCGTemp *)&local_b8;
  pTVar21 = (TCGTemp *)dcbase->pc_next;
  tVar1 = dcbase[2].pc_first;
  pTVar28 = *(TCGContext_conflict11 **)(tVar1 + 0x2e8);
  env = (CPUArchState_conflict26 *)cpu->env_ptr;
  uVar11 = cpu_lduw_code_riscv64(env,(abi_ptr)pTVar21);
  tVar2 = dcbase->pc_next;
  local_b8._0_4_ = (uint)tVar2;
  local_b8._4_4_ = (uint)(tVar2 >> 0x20);
  if (*(int *)(tVar1 + 0x57c) == 0) {
    if (*(target_ulong *)(tVar1 + 0x578 + (long)*(int *)(tVar1 + 0x39e0) * 8) == tVar2)
    goto LAB_00c699fb;
  }
  else {
    puVar15 = (undefined1 *)g_tree_lookup(*(GTree **)(tVar1 + 0x780),&local_b8);
    pTVar21 = pTVar25;
    if (puVar15 == &DAT_00000001) {
LAB_00c699fb:
      dcbase->is_jmp = DISAS_TARGET_6;
      return;
    }
  }
  plVar16 = *(long **)(tVar1 + 0x358);
  local_70 = env;
  if (plVar16 != (long *)0x0) {
    uVar3 = dcbase->pc_next;
LAB_00c6999e:
    lVar4 = plVar16[1];
    uVar5 = *(ulong *)(lVar4 + 0x18);
    uVar6 = *(ulong *)(lVar4 + 0x20);
    pTVar21 = (TCGTemp *)
              CONCAT71((int7)(uVar5 >> 8),uVar6 < uVar5 || uVar3 <= uVar6 && uVar5 <= uVar3);
    if ((uVar5 <= uVar6 && (uVar3 > uVar6 || uVar5 > uVar3)) || (*(char *)(lVar4 + 0x14) == '\x01'))
    goto LAB_00c699d1;
    local_78 = (TCGTemp *)(ulong)uVar11;
    tcg_gen_op2_riscv64(pTVar28,INDEX_op_movi_i64,(TCGArg)(pTVar28->cpu_pc + (long)pTVar28),uVar3);
    local_68 = ((pTVar28->ops).tqh_circ.tql_prev)->tql_prev->tql_next;
    tVar2 = dcbase->pc_next;
    local_90 = (DisasContext_conflict12 *)dcbase;
    pTVar17 = tcg_const_i32_riscv64(pTVar28,4);
    pTVar23 = tcg_const_i64_riscv64(pTVar28,tVar1);
    pTVar30 = tcg_const_i64_riscv64(pTVar28,tVar2);
    pTVar21 = (TCGTemp *)(pTVar23 + (long)pTVar28);
    pTVar26 = (TCGTemp *)(pTVar30 + (long)pTVar28);
    pTVar25 = (TCGTemp *)(pTVar17 + (long)pTVar28);
    local_40 = (TCGTemp *)0x0;
    local_88 = pTVar28;
    local_80 = pTVar25;
    local_60 = pTVar21;
    local_58 = pTVar21;
    local_50 = pTVar26;
    local_48 = pTVar25;
    if (*(int *)(tVar1 + 0x4f8) == 1) {
      puVar27 = *(undefined8 **)(tVar1 + 0x358);
      while( true ) {
        pTVar28 = local_88;
        if (puVar27 == (undefined8 *)0x0) break;
        lVar4 = puVar27[1];
        if (*(char *)(lVar4 + 0x14) == '\0') {
          pTVar23 = tcg_const_i64_riscv64(local_88,*(int64_t *)(lVar4 + 0x30));
          local_40 = (TCGTemp *)(pTVar23 + (long)pTVar28);
          (**(code **)(tVar1 + 0x178))(tVar1,lVar4,&local_58,4);
          tcg_temp_free_internal_riscv64(pTVar28,(TCGTemp *)(pTVar23 + (long)pTVar28));
        }
        puVar27 = (undefined8 *)*puVar27;
      }
    }
    else {
      pTVar17 = tcg_const_i32_riscv64(pTVar28,2);
      local_a8 = pTVar21;
      local_a0 = pTVar26;
      local_b8 = pTVar25;
      local_b0 = (TCGTemp *)(pTVar17 + (long)pTVar28);
      tcg_gen_callN_riscv64(pTVar28,helper_uc_tracecode,(TCGTemp *)0x0,4,(TCGTemp **)&local_b8);
      tcg_temp_free_internal_riscv64(pTVar28,(TCGTemp *)(pTVar17 + (long)pTVar28));
    }
    pTVar28 = local_88;
    tcg_temp_free_internal_riscv64(local_88,pTVar26);
    tcg_temp_free_internal_riscv64(pTVar28,local_60);
    pTVar21 = local_80;
    tcg_temp_free_internal_riscv64(pTVar28,local_80);
    check_exit_request_riscv64(pTVar28);
    bVar8 = true;
    pTVar26 = local_78;
    dcbase = &local_90->base;
    pTVar25 = local_b0;
    goto LAB_00c69b8c;
  }
LAB_00c699d9:
  bVar8 = false;
  local_68 = (void *)0x0;
  pTVar26 = (TCGTemp *)(ulong)uVar11;
  pTVar25 = (TCGTemp *)CONCAT44(local_b0._4_4_,(uint)local_b0);
LAB_00c69b8c:
  local_b0._4_4_ = (undefined4)((ulong)pTVar25 >> 0x20);
  uVar7 = (uint)pTVar26;
  uVar13 = uVar7 & 0xffff;
  local_b0 = pTVar25;
  if (((ushort)pTVar26 & 3) == 3) {
    uVar11 = cpu_lduw_code_riscv64(local_70,(((DisasContext_conflict12 *)dcbase)->base).pc_next + 2)
    ;
    ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
         (((DisasContext_conflict12 *)dcbase)->base).pc_next + 4;
    _Var10 = decode_insn32((DisasContext_conflict12 *)dcbase,uVar13 | uVar11 << 0x10);
    if (_Var10) goto LAB_00c69bf1;
    ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
         (((DisasContext_conflict12 *)dcbase)->base).pc_next - 4;
    pTVar25 = local_b0;
  }
  else if ((((DisasContext_conflict12 *)dcbase)->misa & 4) != 0) {
    ((DisasContext_conflict12 *)dcbase)->invalid = false;
    ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
         (((DisasContext_conflict12 *)dcbase)->base).pc_next + 2;
    uVar12 = uVar7 & 0xe003;
    pTVar9 = local_b8;
    if (uVar12 < 0x6002) {
      if (0x2001 < uVar12) {
        if (0x4001 < uVar12) {
          if (uVar12 == 0x4002) {
            if (((ulong)pTVar26 & 0xf80) != 0) {
              local_b8._0_4_ =
                   (((uint)((ulong)pTVar26 >> 9) & 8 | (uint)((ulong)pTVar26 >> 4) & 7) +
                   (uVar7 & 0xc) * 4) * 4;
              local_b0._0_4_ = 2;
              local_b8._4_4_ = uVar7 >> 7 & 0x1f;
              goto LAB_00c6a5a5;
            }
          }
          else {
            if (uVar12 == 0x6000) {
              local_b8._0_4_ = (uVar13 >> 2 & 0x18 | (uint)((ulong)pTVar26 >> 10) & 7) << 3;
              local_b0._0_4_ = uVar7 >> 7 & 7 | 8;
              local_b8._4_4_ = uVar13 >> 2 & 7 | 8;
              goto LAB_00c6a3d1;
            }
            if (uVar12 != 0x6001) goto LAB_00c6a425;
            if (((ulong)pTVar26 & 0x107c) != 0) {
              if ((uVar7 & 0xf80) != 0x100) {
                if (((ulong)pTVar26 >> 7 & 0x1f) != 0) {
                  pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
                  tcg_gen_op2_riscv64(pTVar22,INDEX_op_movi_i64,
                                      (TCGArg)((long)&pTVar22->pool_cur +
                                              (long)pTVar22->cpu_gpr
                                                    [(uint)((ulong)pTVar26 >> 7) & 0x1f]),
                                      (long)(int)((uVar7 >> 2 & 0x1f |
                                                  (int)(uVar7 << 0x13) >> 0x1f & 0xfffe0U) << 0xc));
                }
                goto LAB_00c6a718;
              }
              local_b8._0_4_ =
                   ((int)(uVar7 << 0x13) >> 0x1f & 0xfffffe0U |
                   uVar7 & 0x18 | (uint)((ulong)pTVar26 >> 1) & 2 | (uint)((ulong)pTVar26 >> 6) & 1
                   | (uint)((ulong)pTVar26 >> 3) & 4) << 4;
              local_b8._4_4_ = 2;
              local_b0._0_4_ = 2;
              goto LAB_00c6a20b;
            }
          }
LAB_00c6a70b:
          generate_exception((DisasContext_conflict12 *)dcbase,2);
          goto LAB_00c6a718;
        }
        if (uVar12 == 0x2002) {
          local_b8._0_4_ =
               (((uint)((ulong)pTVar26 >> 10) & 4 | (uint)((ulong)pTVar26 >> 5) & 3) +
               (uVar7 & 0x1c) * 2) * 8;
          local_b0._0_4_ = 2;
          local_b8._4_4_ = (uint)((ulong)pTVar26 >> 7) & 0x1f;
LAB_00c6a415:
          _Var10 = trans_fld((DisasContext_conflict12 *)dcbase,(arg_fld *)&local_b8);
          goto LAB_00c6a41d;
        }
        if (uVar12 != 0x4000) {
          if (uVar12 == 0x4001) {
            local_b8._0_4_ =
                 (int)(uVar7 << 0x13) >> 0x1f & 0xffffffe0U | (uint)((ulong)pTVar26 >> 2) & 0x1f;
            local_b0._0_4_ = 0;
LAB_00c69d45:
            local_b8._4_4_ = uVar7 >> 7 & 0x1f;
            goto LAB_00c6a20b;
          }
          goto LAB_00c6a425;
        }
        local_b8._0_4_ =
             ((uint)((ulong)pTVar26 >> 1) & 0x10 |
             (uint)((ulong)pTVar26 >> 9) & 0xe | (uint)((ulong)pTVar26 >> 6) & 1) << 2;
        local_b0._0_4_ = (uint)((ulong)pTVar26 >> 7) & 7 | 8;
        local_b8._4_4_ = uVar7 >> 2 & 7 | 8;
LAB_00c6a5a5:
        MVar18 = MO_LESL;
LAB_00c6a5b1:
        gen_load((DisasContext_conflict12 *)dcbase,(arg_lb *)&local_b8,MVar18);
        goto LAB_00c6a718;
      }
      if (uVar12 == 1 || ((ulong)pTVar26 & 0xe003) == 0) {
        if (((ulong)pTVar26 & 0xe003) == 0) {
          if (((ulong)pTVar26 & 0x1fe0) == 0) {
            ((DisasContext_conflict12 *)dcbase)->invalid = true;
            goto LAB_00c6a70b;
          }
          local_b8._0_4_ =
               ((uint)((ulong)pTVar26 >> 3) & 0xf0 |
               (uint)((ulong)pTVar26 >> 9) & 0xc |
               (uint)((ulong)pTVar26 >> 4) & 2 | (uint)((ulong)pTVar26 >> 6) & 1) << 2;
          local_b0._0_4_ = 2;
          local_b8._4_4_ = uVar7 >> 2 & 7 | 8;
        }
        else {
          if (uVar12 != 1) goto LAB_00c6a425;
          local_b8._0_4_ =
               (int)(uVar7 << 0x13) >> 0x1f & 0xffffffe0U | (uint)((ulong)pTVar26 >> 2) & 0x1f;
          local_b8._4_4_ = uVar7 >> 7 & 0x1f;
          local_b0._0_4_ = local_b8._4_4_;
        }
LAB_00c6a20b:
        pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
        pcVar19 = tcg_gen_addi_i64_riscv64;
LAB_00c6a21d:
        gen_arith_imm_fn((DisasContext_conflict12 *)pTVar22,(arg_i_conflict *)&local_b8,pcVar19);
        goto LAB_00c6a718;
      }
      if (uVar12 == 2) {
        local_b8._0_4_ = uVar13 >> 7 & 0x1f;
        uVar13 = uVar13 >> 7 & 0x20 | (uint)((ulong)pTVar26 >> 2) & 0x1f;
        local_b0._0_4_ = 0x40;
        if (uVar13 != 0) {
          local_b0._0_4_ = uVar13;
        }
        local_b8._4_4_ = (uint)local_b8;
        _Var10 = trans_slli((DisasContext_conflict12 *)
                            ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx,(arg_slli *)&local_b8);
        goto LAB_00c6a41d;
      }
      if (uVar12 == 0x2000) {
        local_b8._0_4_ = (uVar13 >> 2 & 0x18 | (uint)((ulong)pTVar26 >> 10) & 7) << 3;
        local_b0._0_4_ = (uint)((ulong)pTVar26 >> 7) & 7 | 8;
        local_b8._4_4_ = uVar13 >> 2 & 7 | 8;
        goto LAB_00c6a415;
      }
      if (uVar12 == 0x2001) {
        if (((ulong)pTVar26 & 0xf80) != 0) {
          local_b8._0_4_ =
               (int)(uVar7 << 0x13) >> 0x1f & 0xffffffe0U | (uint)((ulong)pTVar26 >> 2) & 0x1f;
          local_b8._4_4_ = uVar7 >> 7 & 0x1f;
          local_b0._0_4_ = local_b8._4_4_;
          gen_arith_imm_tl((DisasContext_conflict12 *)
                           ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx,
                           (arg_i_conflict *)&local_b8,gen_addw);
          goto LAB_00c6a718;
        }
        goto LAB_00c6a70b;
      }
LAB_00c6a425:
      if (((ulong)pTVar26 & 3) == 0) {
        uVar3 = ((ulong)pTVar26 & 0xffff) >> 0xd;
        bVar20 = (byte)(((ulong)pTVar26 & 0xffffffff) >> 2) & 7 | 8;
        uVar13 = (uint)((ulong)pTVar26 & 0xffff) >> 7;
        bVar24 = (byte)uVar13 & 7 | 8;
        local_90 = (DisasContext_conflict12 *)dcbase;
        local_88 = pTVar28;
        local_b8 = pTVar9;
        local_b0 = pTVar25;
        if ((char)uVar3 == '\a') {
          local_70 = (CPUArchState_conflict26 *)(ulong)((uVar13 & 0x38) + (uVar7 & 0x60) * 2);
          pTVar28 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
          local_80 = tcg_temp_new_internal_riscv64(pTVar28,TCG_TYPE_I64,false);
          pTVar30 = (TCGv_i64)((long)local_80 - (long)pTVar28);
          local_78 = tcg_temp_new_internal_riscv64(pTVar28,TCG_TYPE_I64,false);
          pTVar23 = (TCGv_i64)((long)local_78 - (long)pTVar28);
          if (pTVar28->cpu_gpr[bVar24] != pTVar30) {
            tcg_gen_op2_riscv64(pTVar28,INDEX_op_mov_i64,(TCGArg)local_80,
                                (TCGArg)(pTVar28->cpu_gpr[bVar24] + (long)pTVar28));
          }
          tcg_gen_addi_i64_riscv64(pTVar28,pTVar30,pTVar30,(int64_t)local_70);
          if (pTVar28->cpu_gpr[bVar20] != pTVar23) {
            tcg_gen_op2_riscv64(pTVar28,INDEX_op_mov_i64,(TCGArg)local_78,
                                (TCGArg)(pTVar28->cpu_gpr[bVar20] + (long)pTVar28));
          }
          dcbase = &local_90->base;
          tcg_gen_qemu_st_i64_riscv64(pTVar28,pTVar23,pTVar30,(ulong)local_90->mem_idx,MO_64);
          tcg_temp_free_internal_riscv64(pTVar28,(TCGTemp *)(pTVar30 + (long)pTVar28));
          tcg_temp_free_internal_riscv64(pTVar28,(TCGTemp *)(pTVar23 + (long)pTVar28));
          pTVar28 = local_88;
        }
        else if ((int)uVar3 == 3) {
          local_70 = (CPUArchState_conflict26 *)(ulong)((uVar13 & 0x38) + (uVar7 & 0x60) * 2);
          pTVar28 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
          local_80 = tcg_temp_new_internal_riscv64(pTVar28,TCG_TYPE_I64,false);
          pTVar30 = (TCGv_i64)((long)local_80 - (long)pTVar28);
          local_78 = tcg_temp_new_internal_riscv64(pTVar28,TCG_TYPE_I64,false);
          pTVar23 = (TCGv_i64)((long)local_78 - (long)pTVar28);
          if (pTVar28->cpu_gpr[bVar24] != pTVar30) {
            tcg_gen_op2_riscv64(pTVar28,INDEX_op_mov_i64,(TCGArg)local_80,
                                (TCGArg)(pTVar28->cpu_gpr[bVar24] + (long)pTVar28));
          }
          tcg_gen_addi_i64_riscv64(pTVar28,pTVar30,pTVar30,(int64_t)local_70);
          tcg_gen_qemu_ld_i64_riscv64(pTVar28,pTVar23,pTVar30,(ulong)local_90->mem_idx,MO_64);
          if (pTVar28->cpu_gpr[bVar20] != pTVar23) {
            tcg_gen_op2_riscv64(pTVar28,INDEX_op_mov_i64,
                                (TCGArg)(pTVar28->cpu_gpr[bVar20] + (long)pTVar28),(TCGArg)local_78)
            ;
          }
          tcg_temp_free_internal_riscv64(pTVar28,(TCGTemp *)(pTVar30 + (long)pTVar28));
          tcg_temp_free_internal_riscv64(pTVar28,(TCGTemp *)(pTVar23 + (long)pTVar28));
          dcbase = &local_90->base;
          pTVar28 = local_88;
        }
      }
    }
    else {
      uVar14 = (uint)((ulong)pTVar26 >> 8);
      if (0xbfff < uVar12) {
        if (uVar12 < 0xe000) {
          if (uVar12 == 0xc000) {
            local_b8._0_4_ =
                 (uint)((ulong)pTVar26 >> 1) & 0x10 |
                 (uint)((ulong)pTVar26 >> 9) & 0xe | (uint)((ulong)pTVar26 >> 6) & 1;
            local_b8._4_4_ = (uint)((ulong)pTVar26 >> 7) & 7 | 8;
            local_b0._0_4_ = uVar7 >> 2 & 7 | 8;
          }
          else {
            if (uVar12 == 0xc001) {
              local_b8._0_4_ =
                   (uVar7 & 0x60 | uVar14 & 0xc | (uint)((ulong)pTVar26 >> 3) & 3) + (uVar7 & 4) * 4
                   | (int)(uVar7 << 0x13) >> 0x1f & 0x7fffff80U;
              cond = TCG_COND_EQ;
LAB_00c6a1a8:
              local_b8._4_4_ = uVar7 >> 7 & 7 | 8;
              local_b8._0_4_ = (uint)local_b8 * 2;
              local_b0._0_4_ = 0;
              gen_branch((DisasContext_conflict12 *)dcbase,(arg_b *)&local_b8,cond);
              goto LAB_00c6a718;
            }
            if (uVar12 != 0xc002) goto LAB_00c6a425;
            local_b8._0_4_ = (uint)((ulong)pTVar26 >> 3) & 0x30 | (uint)((ulong)pTVar26 >> 9) & 0xf;
            local_b8._4_4_ = 2;
            local_b0._0_4_ = uVar7 >> 2 & 0x1f;
          }
          local_b8._0_4_ = (uint)local_b8 << 2;
          MVar18 = MO_LESL;
        }
        else {
          if (uVar12 == 0xe000) {
            local_b8._0_4_ = uVar13 >> 2 & 0x18 | (uint)((ulong)pTVar26 >> 10) & 7;
            local_b8._4_4_ = uVar7 >> 7 & 7 | 8;
            local_b0._0_4_ = uVar13 >> 2 & 7 | 8;
          }
          else {
            if (uVar12 == 0xe001) {
              local_b8._0_4_ =
                   (uVar7 & 0x60 | uVar14 & 0xc | (uint)((ulong)pTVar26 >> 3) & 3) + (uVar7 & 4) * 4
                   | (int)(uVar7 << 0x13) >> 0x1f & 0x7fffff80U;
              cond = TCG_COND_NE;
              goto LAB_00c6a1a8;
            }
            if (uVar12 != 0xe002) goto LAB_00c6a425;
            local_b8._0_4_ = (uint)((ulong)pTVar26 >> 4) & 0x38 | (uint)((ulong)pTVar26 >> 10) & 7;
            local_b8._4_4_ = 2;
            local_b0._0_4_ = uVar7 >> 2 & 0x1f;
          }
          local_b8._0_4_ = (uint)local_b8 << 3;
          MVar18 = MO_64;
        }
        gen_store((DisasContext_conflict12 *)dcbase,(arg_sb *)&local_b8,MVar18);
        goto LAB_00c6a718;
      }
      if (0x9fff < uVar12) {
        if (uVar12 == 0xa000) {
          local_b8._0_4_ = uVar13 >> 2 & 0x18 | (uint)((ulong)pTVar26 >> 10) & 7;
          local_b8._4_4_ = (uint)((ulong)pTVar26 >> 7) & 7 | 8;
          local_b0._0_4_ = uVar13 >> 2 & 7 | 8;
        }
        else {
          if (uVar12 == 0xa001) {
            trans_jal((DisasContext_conflict12 *)dcbase,
                      (arg_jal *)
                      (ulong)((((uint)((ulong)pTVar26 >> 2) & 0x1a0 |
                               uVar7 & 0x40 | uVar14 & 8 | (uint)((ulong)pTVar26 >> 3) & 7) +
                               (uVar7 & 4) * 4 + (uVar7 & 0x100) * 2 |
                              (int)(uVar7 << 0x13) >> 0x1f & 0x7ffffc00U) * 2));
            goto LAB_00c6a718;
          }
          if (uVar12 != 0xa002) goto LAB_00c6a425;
          local_b8._0_4_ = (uint)((ulong)pTVar26 >> 4) & 0x38 | (uint)((ulong)pTVar26 >> 10) & 7;
          local_b8._4_4_ = 2;
          local_b0._0_4_ = (uint)((ulong)pTVar26 >> 2) & 0x1f;
        }
        local_b8._0_4_ = (uint)local_b8 << 3;
        _Var10 = trans_fsd((DisasContext_conflict12 *)dcbase,(arg_fsd *)&local_b8);
        goto LAB_00c6a41d;
      }
      if (uVar12 == 0x6002) {
        if (((ulong)pTVar26 & 0xf80) == 0) goto LAB_00c6a70b;
        local_b8._0_4_ =
             (((uint)((ulong)pTVar26 >> 10) & 4 | (uint)((ulong)pTVar26 >> 5) & 3) +
             (uVar7 & 0x1c) * 2) * 8;
        local_b0._0_4_ = 2;
        local_b8._4_4_ = uVar7 >> 7 & 0x1f;
LAB_00c6a3d1:
        MVar18 = MO_64;
        goto LAB_00c6a5b1;
      }
      if (uVar12 == 0x8001) {
        switch((uint)((ulong)pTVar26 >> 10) & 3) {
        case 0:
          local_b8._0_4_ = uVar13 >> 7 & 7 | 8;
          uVar13 = uVar13 >> 7 & 0x20 | (uint)((ulong)pTVar26 >> 2) & 0x1f;
          local_b0._0_4_ = 0x40;
          if (uVar13 != 0) {
            local_b0._0_4_ = uVar13;
          }
          local_b8._4_4_ = (uint)local_b8;
          _Var10 = trans_srli((DisasContext_conflict12 *)
                              ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx,(arg_srli *)&local_b8
                             );
          break;
        case 1:
          local_b8._0_4_ = uVar13 >> 7 & 7 | 8;
          uVar13 = uVar13 >> 7 & 0x20 | (uint)((ulong)pTVar26 >> 2) & 0x1f;
          local_b0._0_4_ = 0x40;
          if (uVar13 != 0) {
            local_b0._0_4_ = uVar13;
          }
          local_b8._4_4_ = (uint)local_b8;
          _Var10 = trans_srai((DisasContext_conflict12 *)
                              ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx,(arg_srai *)&local_b8
                             );
          break;
        case 2:
          local_b8._0_4_ =
               (int)(uVar7 << 0x13) >> 0x1f & 0xffffffe0U | (uint)((ulong)pTVar26 >> 2) & 0x1f;
          local_b8._4_4_ = uVar7 >> 7 & 7 | 8;
          pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
          pcVar19 = tcg_gen_andi_i64_riscv64;
          local_b0._0_4_ = local_b8._4_4_;
          goto LAB_00c6a21d;
        case 3:
          uVar13 = (uint)((ulong)pTVar26 >> 2);
          local_b0._0_4_ = uVar13 & 7 | 8;
          pTVar25 = (TCGTemp *)(CONCAT44(local_b0._4_4_,uVar13) & 0xffffffff00000007 | 8);
          uVar12 = (uint)((ulong)pTVar26 >> 7);
          local_b8._4_4_ = uVar12 & 7 | 8;
          pTVar9 = (TCGTemp *)(CONCAT44(uVar12,uVar12) & 0x700000007 | 0x800000008);
          uVar14 = uVar7 & 0x1060;
          if (uVar14 < 0x60) {
            if (((ulong)pTVar26 & 0x1060) == 0) {
              pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
              pcVar19 = tcg_gen_sub_i64;
            }
            else if (uVar14 == 0x20) {
              pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
              pcVar19 = tcg_gen_xor_i64_riscv64;
            }
            else {
              pTVar9 = (TCGTemp *)(CONCAT44(uVar12,uVar12) & 0x700000007 | 0x800000008);
              pTVar25 = (TCGTemp *)(CONCAT44(local_b0._4_4_,uVar13) & 0xffffffff00000007 | 8);
              if (uVar14 != 0x40) goto LAB_00c6a425;
              pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
              pcVar19 = tcg_gen_or_i64_riscv64;
            }
          }
          else if (uVar14 == 0x60) {
            pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
            pcVar19 = tcg_gen_and_i64_riscv64;
          }
          else if (uVar14 == 0x1000) {
            pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
            pcVar19 = gen_subw;
          }
          else {
            if (uVar14 != 0x1020) goto LAB_00c6a425;
            pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
            pcVar19 = gen_addw;
          }
LAB_00c6a947:
          local_b8._0_4_ = local_b8._4_4_;
          gen_arith(pTVar22,(arg_r_conflict *)&local_b8,pcVar19);
          goto LAB_00c6a718;
        }
LAB_00c6a41d:
        pTVar9 = (TCGTemp *)CONCAT44(local_b8._4_4_,(uint)local_b8);
        pTVar25 = (TCGTemp *)CONCAT44(local_b0._4_4_,(uint)local_b0);
        if (_Var10 == false) goto LAB_00c6a425;
      }
      else {
        if (uVar12 != 0x8002) goto LAB_00c6a425;
        if ((uVar7 >> 0xc & 1) == 0) {
          if (((ulong)pTVar26 & 0xffc) == 0) goto LAB_00c6a70b;
          local_b8._0_4_ = 0;
          if (((ulong)pTVar26 & 0x7c) != 0) {
            local_b0._0_4_ = (uint)((ulong)pTVar26 >> 2) & 0x1f;
            goto LAB_00c69d45;
          }
          local_b8._4_4_ = 0;
        }
        else {
          if (((ulong)pTVar26 & 0xffc) == 0) {
            trans_ebreak((DisasContext_conflict12 *)dcbase,(arg_ebreak *)pTVar21);
            goto LAB_00c6a718;
          }
          if (((ulong)pTVar26 & 0x7c) != 0) {
            local_b0._0_4_ = (uint)((ulong)pTVar26 >> 2) & 0x1f;
            local_b8._4_4_ = uVar7 >> 7 & 0x1f;
            pTVar22 = ((DisasContext_conflict12 *)dcbase)->uc->tcg_ctx;
            pcVar19 = tcg_gen_add_i64;
            goto LAB_00c6a947;
          }
          local_b8._4_4_ = 1;
        }
        local_b0._0_4_ = uVar7 >> 7 & 0x1f;
        local_b8._0_4_ = 0;
        trans_jalr((DisasContext_conflict12 *)dcbase,(arg_jalr *)&local_b8);
      }
LAB_00c6a718:
      if (((DisasContext_conflict12 *)dcbase)->invalid == true) {
        ((DisasContext_conflict12 *)dcbase)->pc_succ_insn =
             ((DisasContext_conflict12 *)dcbase)->pc_succ_insn - 2;
      }
    }
    goto LAB_00c69bf1;
  }
  local_b0 = pTVar25;
  generate_exception((DisasContext_conflict12 *)dcbase,2);
LAB_00c69bf1:
  if (bVar8) {
    paVar29 = &pTVar28->ops;
    if (local_68 != (void *)0x0) {
      paVar29 = (anon_union_16_2_88bb8dd4_for_ops_free_ops *)((long)local_68 + 8);
    }
    paVar29->tqh_first->args[1] =
         ((DisasContext_conflict12 *)dcbase)->pc_succ_insn -
         (((DisasContext_conflict12 *)dcbase)->base).pc_next;
  }
  tVar1 = ((DisasContext_conflict12 *)dcbase)->pc_succ_insn;
  (((DisasContext_conflict12 *)dcbase)->base).pc_next = tVar1;
  if (((((DisasContext_conflict12 *)dcbase)->base).is_jmp == DISAS_NEXT) &&
     (0xfff < tVar1 - ((((DisasContext_conflict12 *)dcbase)->base).pc_first & 0xfffffffffffff000)))
  {
    (((DisasContext_conflict12 *)dcbase)->base).is_jmp = DISAS_TOO_MANY;
  }
  return;
LAB_00c699d1:
  plVar16 = (long *)*plVar16;
  if (plVar16 == (long *)0x0) goto LAB_00c699d9;
  goto LAB_00c6999e;
}

Assistant:

static void riscv_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *ctx = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = ctx->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPURISCVState *env = cpu->env_ptr;
    uint16_t opcode16 = translator_lduw(tcg_ctx, env, ctx->base.pc_next);
    TCGOp *tcg_op, *prev_op = NULL;
    bool insn_hook = false;

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, ctx->base.pc_next)) {
        // Unicorn: We have to exit current execution here.
        dcbase->is_jmp = DISAS_UC_EXIT;
    } else {
        // Unicorn: trace this instruction on request
        if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, ctx->base.pc_next)) {

            // Sync PC in advance
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->base.pc_next);

            // save the last operand
            prev_op = tcg_last_op(tcg_ctx);
            insn_hook = true;
            gen_uc_tracecode(tcg_ctx, 4, UC_HOOK_CODE_IDX, uc, ctx->base.pc_next);
            // the callback might want to stop emulation immediately
            check_exit_request(tcg_ctx);
        }

        decode_opc(env, ctx, opcode16);

        if (insn_hook) {
            // Unicorn: patch the callback to have the proper instruction size.
            if (prev_op) {
                // As explained further up in the function where prev_op is
                // assigned, we move forward in the tail queue, so we're modifying the
                // move instruction generated by gen_uc_tracecode() that contains
                // the instruction size to assign the proper size (replacing 0xF1F1F1F1).
                tcg_op = QTAILQ_NEXT(prev_op, link);
            } else {
                // this instruction is the first emulated code ever,
                // so the instruction operand is the first operand
                tcg_op = QTAILQ_FIRST(&tcg_ctx->ops);
            }

            tcg_op->args[1] = ctx->pc_succ_insn - ctx->base.pc_next;
        }

        ctx->base.pc_next = ctx->pc_succ_insn;

        if (ctx->base.is_jmp == DISAS_NEXT) {
            target_ulong page_start;

            page_start = ctx->base.pc_first & TARGET_PAGE_MASK;
            if (ctx->base.pc_next - page_start >= TARGET_PAGE_SIZE) {
                ctx->base.is_jmp = DISAS_TOO_MANY;
            }
        }
    }
}